

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# radix_partitioned_hashtable.cpp
# Opt level: O3

void __thiscall
duckdb::RadixPartitionedHashTable::PopulateGroupChunk
          (RadixPartitionedHashTable *this,DataChunk *group_chunk,DataChunk *input_chunk)

{
  _Rb_tree_header *p_Var1;
  const_reference this_00;
  pointer this_01;
  BoundReferenceExpression *pBVar2;
  reference this_02;
  reference other;
  _Base_ptr p_Var3;
  size_type __n;
  
  p_Var3 = (this->grouping_set->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var1 = &(this->grouping_set->_M_t)._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var3 != p_Var1) {
    __n = 0;
    do {
      this_00 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                ::operator[](&this->op->groups,*(size_type *)(p_Var3 + 1));
      this_01 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                operator->(this_00);
      pBVar2 = BaseExpression::Cast<duckdb::BoundReferenceExpression>
                         (&this_01->super_BaseExpression);
      this_02 = vector<duckdb::Vector,_true>::operator[](&group_chunk->data,__n);
      other = vector<duckdb::Vector,_true>::operator[](&input_chunk->data,pBVar2->index);
      Vector::Reference(this_02,other);
      p_Var3 = (_Base_ptr)::std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var3);
      __n = __n + 1;
    } while ((_Rb_tree_header *)p_Var3 != p_Var1);
  }
  group_chunk->count = input_chunk->count;
  DataChunk::Verify(group_chunk);
  return;
}

Assistant:

void RadixPartitionedHashTable::PopulateGroupChunk(DataChunk &group_chunk, DataChunk &input_chunk) const {
	idx_t chunk_index = 0;
	// Populate the group_chunk
	for (auto &group_idx : grouping_set) {
		// Retrieve the expression containing the index in the input chunk
		auto &group = op.groups[group_idx];
		D_ASSERT(group->GetExpressionType() == ExpressionType::BOUND_REF);
		auto &bound_ref_expr = group->Cast<BoundReferenceExpression>();
		// Reference from input_chunk[group.index] -> group_chunk[chunk_index]
		group_chunk.data[chunk_index++].Reference(input_chunk.data[bound_ref_expr.index]);
	}
	group_chunk.SetCardinality(input_chunk.size());
	group_chunk.Verify();
}